

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

size_t utf8_char_copy(utf8_char_t *dst,utf8_char_t *src)

{
  size_t __n;
  utf8_char_t *in_RSI;
  void *in_RDI;
  size_t bytes;
  
  __n = utf8_char_length(in_RSI);
  if ((__n != 0) && (in_RDI != (void *)0x0)) {
    memcpy(in_RDI,in_RSI,__n);
    *(undefined1 *)((long)in_RDI + __n) = 0;
  }
  return __n;
}

Assistant:

size_t utf8_char_copy(utf8_char_t* dst, const utf8_char_t* src)
{
    size_t bytes = utf8_char_length(src);

    if (bytes && dst) {
        memcpy(dst, src, bytes);
        dst[bytes] = '\0';
    }

    return bytes;
}